

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O3

void mcpl_update_nparticles(FILE *f,uint64_t n)

{
  int iVar1;
  long __off;
  size_t sVar2;
  uint64_t local_18;
  
  local_18 = n;
  __off = ftell((FILE *)f);
  if (-1 < __off) {
    iVar1 = fseek((FILE *)f,8,0);
    if (iVar1 == 0) {
      sVar2 = fwrite(&local_18,1,8,(FILE *)f);
      if (sVar2 == 8) {
        iVar1 = fseek((FILE *)f,__off,0);
        if (iVar1 == 0) {
          return;
        }
      }
    }
  }
  (*mcpl_error_handler)
            ("Errors encountered while attempting to update number of particles in file.");
  printf("MCPL ERROR: %s\n",
         "Handler given to mcpl_set_error_handler returns to calling code which is not allowed!");
  exit(1);
}

Assistant:

MCPL_LOCAL void mcpl_update_nparticles(FILE* f, uint64_t n)
{
  //Seek and update nparticles at correct location in header:
  const char * errmsg = ( "Errors encountered while attempting "
                          "to update number of particles in file." );
  int64_t savedpos = MCPL_FTELL(f);
  if (savedpos<0)
    mcpl_error(errmsg);
  if (MCPL_FSEEK( f, MCPLIMP_NPARTICLES_POS ))
    mcpl_error(errmsg);
  size_t nb = fwrite(&n, 1, sizeof(n), f);
  if (nb != sizeof(n))
    mcpl_error(errmsg);
  if (MCPL_FSEEK( f, savedpos ))
    mcpl_error(errmsg);
}